

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O0

wchar_t compare_monsters(monster_conflict *mon1,monster_conflict *mon2)

{
  wchar_t local_30;
  wchar_t local_2c;
  uint32_t mexp2;
  uint32_t mexp1;
  monster_conflict *mon2_local;
  monster_conflict *mon1_local;
  
  if (mon1->original_race == (monster_race *)0x0) {
    local_2c = mon1->race->mexp;
  }
  else {
    local_2c = mon1->original_race->mexp;
  }
  if (mon2->original_race == (monster_race *)0x0) {
    local_30 = mon2->race->mexp;
  }
  else {
    local_30 = mon2->original_race->mexp;
  }
  if ((uint)local_2c < (uint)local_30) {
    mon1_local._4_4_ = L'\xffffffff';
  }
  else if ((uint)local_30 < (uint)local_2c) {
    mon1_local._4_4_ = L'\x01';
  }
  else {
    mon1_local._4_4_ = L'\0';
  }
  return mon1_local._4_4_;
}

Assistant:

static int compare_monsters(const struct monster *mon1,
							const struct monster *mon2)
{
	uint32_t mexp1 = (mon1->original_race) ?
		mon1->original_race->mexp : mon1->race->mexp;
	uint32_t mexp2 = (mon2->original_race) ?
		mon2->original_race->mexp : mon2->race->mexp;

	/* Compare */
	if (mexp1 < mexp2) return (-1);
	if (mexp1 > mexp2) return (1);

	/* Assume equal */
	return (0);
}